

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

flexScore negaMax(game *Game,int depth,flexScore alpha,flexScore beta)

{
  double dVar1;
  bool bVar2;
  int depth_00;
  double dVar3;
  flexScore fVar4;
  flexScore beta_00;
  game local_5b0;
  flexScore local_4a0;
  undefined1 local_490 [8];
  flexScore score;
  undefined1 local_474 [8];
  arrayMoveList moves;
  game local_160;
  double local_50;
  double side;
  game *pgStack_40;
  int depth_local;
  game *Game_local;
  flexScore beta_local;
  flexScore alpha_local;
  flexScore returner;
  
  beta_local.score = beta._8_8_;
  Game_local = (game *)beta.score;
  alpha_local.score = alpha._8_8_;
  beta_local._8_8_ = alpha.score;
  side._4_4_ = depth;
  pgStack_40 = Game;
  if (depth == 0) {
    if ((Game->blacksTurn & 1U) == 0) {
      local_50 = 1.0;
    }
    else {
      local_50 = -1.0;
    }
    flexScore::flexScore((flexScore *)&alpha_local.count);
    dVar1 = local_50;
    game::game(&local_160,Game);
    dVar3 = positionStrengthFast(&local_160);
    alpha_local._8_8_ = dVar1 * dVar3;
    game::~game(&local_160);
  }
  else {
    game::generateLegalMoves((arrayMoveList *)local_474,Game);
    arrayMoveList::resetIterator((arrayMoveList *)local_474);
    bVar2 = arrayMoveList::next((arrayMoveList *)local_474);
    if (bVar2) {
      arrayMoveList::resetIterator((arrayMoveList *)local_474);
      while( true ) {
        bVar2 = arrayMoveList::next((arrayMoveList *)local_474);
        if (!bVar2) break;
        score._12_3_ = arrayMoveList::getMove((arrayMoveList *)local_474);
        game::makeMove(Game,(move)score._12_3_);
        game::game(&local_5b0,Game);
        depth_00 = side._4_4_ + -1;
        fVar4 = flexScore::operator--((flexScore *)&Game_local);
        beta_00 = flexScore::operator--((flexScore *)&beta_local.count);
        fVar4 = negaMax(&local_5b0,depth_00,fVar4,beta_00);
        local_4a0 = fVar4;
        fVar4 = flexScore::operator-(&local_4a0);
        score.score = fVar4._8_8_;
        local_490 = (undefined1  [8])fVar4.score;
        game::~game(&local_5b0);
        game::undoMove(Game);
        bVar2 = flexScore::operator>=((flexScore *)local_490,(flexScore *)&Game_local);
        if (bVar2) {
          alpha_local._8_8_ = Game_local;
          returner.score._0_4_ = SUB84(beta_local.score,0);
          returner.score._4_1_ = (undefined1)((ulong)beta_local.score >> 0x20);
          returner.score._5_1_ = (undefined1)((ulong)beta_local.score >> 0x28);
          returner.score._6_2_ = (undefined2)((ulong)beta_local.score >> 0x30);
          goto LAB_00102f7c;
        }
        bVar2 = flexScore::operator>((flexScore *)local_490,(flexScore *)&beta_local.count);
        if (bVar2) {
          flexScore::operator=((flexScore *)&beta_local.count,(flexScore *)local_490);
        }
      }
      alpha_local.count = beta_local.count;
      alpha_local.draw = beta_local.draw;
      alpha_local.tethered = beta_local.tethered;
      alpha_local.favorable = beta_local.favorable;
      alpha_local.extreme = beta_local.extreme;
      returner.score._0_4_ = SUB84(alpha_local.score,0);
      returner.score._4_1_ = (undefined1)((ulong)alpha_local.score >> 0x20);
      returner.score._5_1_ = (undefined1)((ulong)alpha_local.score >> 0x28);
      returner.score._6_2_ = (undefined2)((ulong)alpha_local.score >> 0x30);
    }
    else {
      flexScore::flexScore((flexScore *)&alpha_local.count);
      returner.score._5_1_ = 1;
      returner.score._0_4_ = 0;
      returner.score._4_1_ = 1;
    }
  }
LAB_00102f7c:
  fVar4.count = returner.score._0_4_;
  fVar4.score = (double)alpha_local._8_8_;
  fVar4.draw = (bool)returner.score._4_1_;
  fVar4.tethered = (bool)returner.score._5_1_;
  fVar4.favorable = (bool)returner.score._6_1_;
  fVar4.extreme = (bool)returner.score._7_1_;
  return fVar4;
}

Assistant:

flexScore negaMax(game Game, int depth, flexScore alpha, flexScore beta) {
    if(depth == 0) {
      double side;
      if(Game.blacksTurn) {
        side = -1.0;
      } else {
        side = 1.0;
      }

      flexScore returner;
      returner.score = side*positionStrengthFast(Game);
      return returner;
    }

    arrayMoveList moves = Game.generateLegalMoves();
    moves.resetIterator();
    if(!moves.next()) {
      flexScore returner;
      returner.tethered = true;
      returner.count = 0;
      returner.draw = true; // We currently assume this is a draw
      return returner;
    }
    moves.resetIterator();
    while(moves.next()) {
      Game.makeMove(moves.getMove());
      flexScore score = -negaMax(Game, depth - 1, --beta, --alpha);
      Game.undoMove();
      if(score >= beta) {
        return beta;
      }
      if(score > alpha)
        alpha = score;
    }

    return alpha;
}